

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<tinyusdz::value::matrix4f> *value)

{
  bool bVar1;
  matrix4f v;
  matrix4f local_58;
  
  bVar1 = MaybeNone(this);
  if (bVar1) {
    value->has_value_ = false;
    bVar1 = true;
  }
  else {
    local_58.m[0][0] = 1.0;
    local_58.m[0][1] = 0.0;
    local_58.m[0][2] = 0.0;
    local_58.m[0][3] = 0.0;
    local_58.m[1][0] = 0.0;
    local_58.m[1][1] = 1.0;
    local_58.m[1][2] = 0.0;
    local_58.m[1][3] = 0.0;
    local_58.m[2][0] = 0.0;
    local_58.m[2][1] = 0.0;
    local_58.m[2][2] = 1.0;
    local_58.m[2][3] = 0.0;
    local_58.m[3][0] = 0.0;
    local_58.m[3][1] = 0.0;
    local_58.m[3][2] = 0.0;
    local_58.m[3][3] = 1.0;
    bVar1 = ParseMatrix(this,&local_58);
    if (bVar1) {
      nonstd::optional_lite::optional<tinyusdz::value::matrix4f>::operator=(value,&local_58);
    }
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::matrix4f> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::matrix4f v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}